

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O2

void symmetric_ssl_main(void)

{
  short *psVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  agent_type aVar6;
  uint uVar7;
  void *pvVar8;
  SSL *s;
  size_t sVar9;
  epoll_event *__events;
  int64_t iVar10;
  request *prVar11;
  int64_t iVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  uint64_t uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  timestamp_info *ptVar20;
  uint uVar21;
  timestamp_info *unaff_R13;
  size_t *psVar22;
  tcp_connection *conn;
  long in_FS_OFFSET;
  byte_req_pair bVar23;
  size_t sStack_100;
  int n;
  ulong local_d8;
  int64_t local_d0;
  void *local_c8;
  host_tuple *local_c0;
  long local_b8;
  int one;
  timespec latency;
  timespec rx_timestamp;
  timespec tx_timestamp;
  char hostname [64];
  
  local_c8 = malloc(0x200);
  one = 1;
  tx_timestamp.tv_sec._0_2_ = 2;
  iVar3 = epoll_create(1);
  if (iVar3 < 0) {
    gethostname(hostname,0x40);
    fprintf(_stderr,"[%s] ",hostname);
    pcVar13 = "epoll_create error";
LAB_0010b388:
    perror(pcVar13);
    return;
  }
  iVar4 = get_conn_count();
  iVar5 = get_thread_count();
  uVar18 = (long)iVar4 / (long)iVar5;
  iVar4 = (int)uVar18;
  uVar14 = uVar18 & 0xffffffff;
  pvVar8 = calloc((long)iVar4,0x4018);
  *(void **)(in_FS_OFFSET + -0x1b0) = pvVar8;
  if (pvVar8 == (void *)0x0) {
    pcVar19 = "connections";
    pcVar13 = "int throughput_open_connections(void)";
    uVar21 = 0x74;
  }
  else {
    aVar6 = get_agent_type();
    if ((aVar6 != SYMMETRIC_NIC_TIMESTAMP_AGENT) &&
       (aVar6 = get_agent_type(), aVar6 != SYMMETRIC_AGENT)) {
      uVar14 = 0;
      if (0 < iVar4) {
        uVar14 = uVar18 & 0xffffffff;
      }
LAB_0010ab9a:
      local_c0 = get_targets();
      local_d8 = uVar14 * 0x4018;
      uVar21 = 0;
      lVar17 = 0;
      do {
        if (local_d8 == lVar17) {
          *(int *)(in_FS_OFFSET + -0x1b8) = iVar3;
          iVar3 = get_conn_count();
          iVar4 = get_thread_count();
          local_c0 = (host_tuple *)CONCAT44(local_c0._4_4_,iVar3 / iVar4);
          __events = (epoll_event *)malloc((long)(iVar3 / iVar4) * 0xc);
          pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
          set_conn_open(1);
          local_d8 = 0x200;
          iVar10 = time_ns();
          do {
            while (iVar3 = should_load(), iVar3 == 0) {
              iVar10 = time_ns();
            }
            while (iVar12 = time_ns(), local_d0 = iVar10, iVar10 <= iVar12) {
              uVar21 = *(uint *)(in_FS_OFFSET + -0x1a8);
              *(uint *)(in_FS_OFFSET + -0x1a8) = uVar21 + 1;
              iVar3 = get_conn_count();
              iVar4 = get_thread_count();
              lVar17 = *(long *)(in_FS_OFFSET + -0x1b0);
              lVar15 = (long)(int)((ulong)uVar21 % ((long)iVar3 / (long)iVar4 & 0xffffffffU)) *
                       0x4018;
              uVar2 = *(ushort *)(lVar17 + 8 + lVar15);
              iVar3 = get_max_pending_reqs();
              if ((iVar3 <= (int)(uint)uVar2) ||
                 (lVar17 = lVar17 + lVar15, *(short *)(lVar17 + 6) != 0)) break;
              prVar11 = prepare_request();
              uVar14 = 0;
              uVar18 = (ulong)(uint)prVar11->iov_cnt;
              if (prVar11->iov_cnt < 1) {
                uVar18 = uVar14;
              }
              iVar3 = 0;
              for (; uVar18 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
                iVar3 = iVar3 + *(int *)((long)&prVar11->iovs[0].iov_len + uVar14);
              }
              uVar18 = (ulong)iVar3;
              local_b8 = lVar17;
              if (local_d8 < uVar18) {
                free(local_c8);
                local_c8 = malloc(uVar18);
                local_d8 = uVar18;
              }
              psVar22 = &prVar11->iovs[0].iov_len;
              uVar14 = 0;
              for (lVar17 = 0; lVar15 = local_b8, lVar17 < prVar11->iov_cnt; lVar17 = lVar17 + 1) {
                memcpy((void *)((long)local_c8 + uVar14),((iovec *)(psVar22 + -1))->iov_base,
                       *psVar22);
                uVar14 = uVar14 + *psVar22;
                psVar22 = psVar22 + 2;
              }
              if (uVar14 != uVar18) {
                __assert_fail("copied == bytes_to_send",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                              ,0x11f,"void symmetric_ssl_main(void)");
              }
              iVar4 = SSL_write(*(SSL **)(local_b8 + 0x4010),local_c8,iVar3);
              if (iVar4 != iVar3) {
                __assert_fail("ret == bytes_to_send",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                              ,0x123,"void symmetric_ssl_main(void)");
              }
              time_ns_to_ts(&tx_timestamp);
              push_complete_tx_timestamp
                        ((pending_tx_timestamps *)
                         ((ulong)*(ushort *)(lVar15 + 4) * 0x18 + *(long *)(in_FS_OFFSET + -0x1c0)),
                         &tx_timestamp);
              psVar1 = (short *)(lVar15 + 8);
              *psVar1 = *psVar1 + 1;
              bVar23.reqs = 1;
              bVar23.bytes = uVar18;
              add_throughput_tx_sample(bVar23);
              lVar17 = get_ia();
              iVar10 = local_d0 + lVar17;
            }
            uVar21 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1b8),__events,(int)local_c0,0);
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            for (uVar18 = 0; iVar10 = local_d0, uVar18 != uVar21; uVar18 = uVar18 + 1) {
              if (((&__events->events)[uVar18 * 3] & 1) == 0) {
                __assert_fail("events[i].events & EPOLLIN",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                              ,0x13a,"void symmetric_ssl_main(void)");
              }
              conn = (tcp_connection *)
                     ((long)*(int *)(&__events->field_0x4 + uVar18 * 0xc) * 0x4018 +
                     *(long *)(in_FS_OFFSET + -0x1b0));
              iVar3 = SSL_read(*(SSL **)&conn[1].idx,conn->buffer + conn->buffer_idx,
                               0x4000 - (uint)conn->buffer_idx);
              if (iVar3 < 1) {
                uVar7 = SSL_get_error(*(SSL **)&conn[1].idx,iVar3);
                if (uVar7 != 2) {
                  if (iVar3 != 0) {
                    gethostname(hostname,0x40);
                    fprintf(_stderr,"[%s] ",hostname);
                    fprintf(_stderr,"Unexpected SSL error %d\n",(ulong)uVar7);
                    return;
                  }
                  SSL_shutdown(*(SSL **)&conn[1].idx);
                  SSL_free(*(SSL **)&conn[1].idx);
                  close(conn->fd);
                  conn->closed = 1;
                }
              }
              else {
                time_ns_to_ts(&rx_timestamp);
                conn->buffer_idx = conn->buffer_idx + (short)iVar3;
                bVar23 = handle_response(conn);
                if (bVar23.reqs != 0) {
                  conn->pending_reqs = conn->pending_reqs - (short)bVar23.reqs;
                  uVar16 = 0xffffffffffffffff;
                  while (uVar16 = uVar16 + 1, bVar23.reqs != uVar16) {
                    unaff_R13 = pop_pending_tx_timestamps
                                          ((pending_tx_timestamps *)
                                           ((ulong)conn->idx * 0x18 +
                                           *(long *)(in_FS_OFFSET + -0x1c0)));
                    if (unaff_R13 == (timestamp_info *)0x0) {
                      __assert_fail("pending_tx",
                                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                                    ,0x15e,"void symmetric_ssl_main(void)");
                    }
                  }
                  iVar3 = timespec_diff(&latency,&rx_timestamp,&unaff_R13->time);
                  if (iVar3 != 0) {
                    __assert_fail("ret == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                                  ,0x161,"void symmetric_ssl_main(void)");
                  }
                  add_latency_sample((long)((double)latency.tv_sec * 1000000000.0 +
                                           (double)latency.tv_nsec),&unaff_R13->time);
                  add_throughput_rx_sample(bVar23);
                }
              }
            }
          } while( true );
        }
        iVar4 = socket(2,1,0);
        if (iVar4 == -1) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar13 = "Error creating socket";
          goto LAB_0010b388;
        }
        iVar5 = get_target_count();
        uVar18 = (long)(int)uVar21 % (long)iVar5 & 0xffffffff;
        tx_timestamp.tv_sec._2_2_ = local_c0[uVar18].port << 8 | local_c0[uVar18].port >> 8;
        tx_timestamp.tv_sec._4_4_ = local_c0[uVar18].ip;
        iVar5 = connect(iVar4,(sockaddr *)&tx_timestamp,0x10);
        if (iVar5 != 0) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar13 = "Error connecting";
          goto LAB_0010b388;
        }
        lVar15 = *(long *)(in_FS_OFFSET + -0x1b0);
        *(int *)(lVar15 + lVar17) = iVar4;
        *(short *)(lVar15 + 4 + lVar17) = (short)uVar21;
        *(undefined2 *)(lVar15 + 10 + lVar17) = 0;
        *(undefined4 *)(lVar15 + 6 + lVar17) = 0;
        s = SSL_new((SSL_CTX *)ssl_ctx);
        *(SSL **)(lVar15 + 0x4010 + lVar17) = s;
        if (s == (SSL *)0x0) {
          pcVar19 = "tls_conn->ssl";
          pcVar13 = "int ssl_init_connection(struct tls_connection *)";
          uVar21 = 0x4d;
          goto LAB_0010b4c8;
        }
        iVar5 = SSL_set_fd(s,*(int *)(lVar15 + lVar17));
        if (iVar5 != 1) {
          pcVar19 = "err == 1";
          pcVar13 = "int ssl_init_connection(struct tls_connection *)";
          uVar21 = 0x50;
          goto LAB_0010b4c8;
        }
        iVar5 = SSL_connect(*(SSL **)(lVar15 + 0x4010 + lVar17));
        if (iVar5 < 1) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar13 = "Failed to ssl connect\n";
          sStack_100 = 0x16;
LAB_0010b3d9:
          fwrite(pcVar13,sStack_100,1,_stderr);
          return;
        }
        iVar5 = SSL_is_init_finished(*(undefined8 *)(lVar15 + 0x4010 + lVar17));
        if (iVar5 != 1) {
          pcVar19 = "err == 1";
          pcVar13 = "int ssl_init_connection(struct tls_connection *)";
          uVar21 = 0x5c;
          goto LAB_0010b4c8;
        }
        iVar5 = fcntl(iVar4,4,0x800);
        if (iVar5 == -1) {
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar13 = "Error while setting nonblocking";
          goto LAB_0010b388;
        }
        n = 0x80000;
        iVar5 = setsockopt(iVar4,1,7,&n,4);
        if (iVar5 != 0) {
LAB_0010b1f5:
          gethostname(hostname,0x40);
          fprintf(_stderr,"[%s] ",hostname);
          pcVar13 = "Error setsockopt";
          goto LAB_0010b388;
        }
        n = 0x80000;
        local_b8 = CONCAT44(local_b8._4_4_,iVar4);
        local_d0 = lVar17;
        iVar4 = setsockopt(iVar4,1,8,&n,4);
        if (iVar4 != 0) goto LAB_0010b1f5;
        aVar6 = get_agent_type();
        iVar10 = local_d0;
        iVar4 = (int)local_b8;
        if (aVar6 == SYMMETRIC_NIC_TIMESTAMP_AGENT) {
          pcVar13 = get_if_name();
          pcVar19 = get_if_name();
          sVar9 = strlen(pcVar19);
          iVar5 = setsockopt(iVar4,1,0x19,pcVar13,(socklen_t)sVar9);
          if (iVar5 != 0) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            pcVar13 = "setsockopt SO_BINDTODEVICE";
            goto LAB_0010b388;
          }
          iVar5 = sock_enable_timestamping(iVar4);
          if (iVar5 != 0) {
            gethostname(hostname,0x40);
            fprintf(_stderr,"[%s] ",hostname);
            pcVar13 = "sock enable timestamping failed\n";
            sStack_100 = 0x20;
            goto LAB_0010b3d9;
          }
        }
        iVar5 = setsockopt(iVar4,6,1,&one,4);
        if (iVar5 != 0) goto LAB_0010b1f5;
        latency.tv_sec = 1;
        iVar5 = setsockopt(iVar4,1,0xd,&latency,8);
        if (iVar5 != 0) {
          perror("setsockopt(SO_LINGER)");
          exit(1);
        }
        rx_timestamp.tv_sec._0_4_ = 1;
        rx_timestamp.tv_sec._4_4_ = uVar21;
        iVar4 = epoll_ctl(iVar3,1,iVar4,(epoll_event *)&rx_timestamp);
        lVar17 = iVar10 + 0x4018;
        uVar21 = uVar21 + 1;
        unaff_R13 = (timestamp_info *)(ulong)uVar21;
      } while (iVar4 == 0);
      gethostname(hostname,0x40);
      fprintf(_stderr,"[%s] ",hostname);
      pcVar13 = "Error while adding to epoll group";
      goto LAB_0010b388;
    }
    pvVar8 = calloc((long)iVar4,0x18);
    *(void **)(in_FS_OFFSET + -0x1c0) = pvVar8;
    if (pvVar8 == (void *)0x0) {
      pcVar19 = "per_conn_tx_timestamps";
      pcVar13 = "int throughput_open_connections(void)";
      uVar21 = 0x79;
    }
    else {
      if (iVar4 < 1) {
        uVar14 = 0;
      }
      ptVar20 = (timestamp_info *)0x0;
      do {
        unaff_R13 = ptVar20 + 1;
        if ((timestamp_info *)(uVar14 * 0x18 + 0x18) == unaff_R13) goto LAB_0010ab9a;
        iVar4 = get_max_pending_reqs();
        pvVar8 = calloc((long)iVar4,0x18);
        *(void **)((long)&ptVar20->optid + *(long *)(in_FS_OFFSET + -0x1c0)) = pvVar8;
        ptVar20 = unaff_R13;
      } while (pvVar8 != (void *)0x0);
      pcVar19 = "per_conn_tx_timestamps[i].pending";
      pcVar13 = "int throughput_open_connections(void)";
      uVar21 = 0x7d;
    }
  }
LAB_0010b4c8:
  __assert_fail(pcVar19,
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                ,uVar21,pcVar13);
}

Assistant:

static void symmetric_ssl_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx, copied;
	struct epoll_event *events;
	struct tls_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp, rx_timestamp, latency;
	struct timestamp_info *pending_tx;
	char *wbuf;
	uint64_t wbuf_size = 512;

	wbuf = malloc(wbuf_size);

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();

			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			if (bytes_to_send > wbuf_size) {
				free(wbuf);
				wbuf = malloc(bytes_to_send);
				wbuf_size = bytes_to_send;
			}

			copied = 0;
			for (i = 0; i < to_send->iov_cnt; i++) {
				memcpy(&wbuf[copied], to_send->iovs[i].iov_base,
					   to_send->iovs[i].iov_len);
				copied += to_send->iovs[i].iov_len;
			}
			assert(copied == bytes_to_send);

			int ret = SSL_write(conn->ssl, wbuf, bytes_to_send);

			assert(ret == bytes_to_send);

			time_ns_to_ts(&tx_timestamp);
			push_complete_tx_timestamp(&per_conn_tx_timestamps[conn->conn.idx],
									   &tx_timestamp);
			conn->conn.pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}

	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			assert(events[i].events & EPOLLIN);

			// read into the connection buffer
			ret = SSL_read(conn->ssl, &conn->conn.buffer[conn->conn.buffer_idx],
						   MAX_PAYLOAD - conn->conn.buffer_idx);
			if (ret <= 0) {
				int ssl_err = SSL_get_error(conn->ssl, ret);
				if (ssl_err == SSL_ERROR_WANT_READ)
					continue;

				if (ret == 0) {
					SSL_shutdown(conn->ssl);
					SSL_free(conn->ssl);
					close(conn->conn.fd);
					conn->conn.closed = 1;
					continue;
				}

				lancet_fprintf(stderr, "Unexpected SSL error %d\n", ssl_err);
				return;
			}

			time_ns_to_ts(&rx_timestamp);
			conn->conn.buffer_idx += ret;

			read_res = handle_response(&conn->conn);
			if (read_res.reqs == 0)
				continue;

			conn->conn.pending_reqs -= read_res.reqs;
			/*
			 * Assume only the last request will have an rx timestamp!
			 */
			for (j = 0; j < read_res.reqs; j++) {
				pending_tx = pop_pending_tx_timestamps(
					&per_conn_tx_timestamps[conn->conn.idx]);
				assert(pending_tx);
			}
			ret = timespec_diff(&latency, &rx_timestamp, &pending_tx->time);
			assert(ret == 0);
			long diff = latency.tv_nsec + latency.tv_sec * 1e9;
			add_latency_sample(diff, &pending_tx->time);

			/* Bookkeeping */
			add_throughput_rx_sample(read_res);
		}
	}
}